

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scp_dev.cpp
# Opt level: O2

bool WriteSuperCardPro(string *path,shared_ptr<Disk> *disk)

{
  bool bVar1;
  int def_cyls;
  int def_heads;
  exception *this;
  pointer *__ptr;
  long *local_58;
  shared_ptr<SCPDevDisk> scp_dev_disk;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  util::lowercase((string *)&local_40,path);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_40,"scp:");
  std::__cxx11::string::~string((string *)local_40._M_pod_data);
  if (!bVar1) {
    SuperCardPro::Open();
    if (local_58 == (long *)0x0) {
      this = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[36]>
                (this,(char (*) [36])"failed to open SuperCard Pro device");
      __cxa_throw(this,&util::exception::typeinfo,std::runtime_error::~runtime_error);
    }
    std::make_shared<SCPDevDisk,std::unique_ptr<SuperCardPro,std::default_delete<SuperCardPro>>>
              ((unique_ptr<SuperCardPro,_std::default_delete<SuperCardPro>_> *)&scp_dev_disk);
    def_cyls = Disk::cyls((Disk *)scp_dev_disk.
                                  super___shared_ptr<SCPDevDisk,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
    def_heads = Disk::heads((Disk *)scp_dev_disk.
                                    super___shared_ptr<SCPDevDisk,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr);
    ValidateRange(&opt.range,0x80,2,1,def_cyls,def_heads);
    local_28 = std::
               _Function_handler<void_(const_CylHead_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/types/scp_dev.cpp:159:20)>
               ::_M_invoke;
    local_30 = std::
               _Function_handler<void_(const_CylHead_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/types/scp_dev.cpp:159:20)>
               ::_M_manager;
    local_40._M_unused._M_object = disk;
    local_40._8_8_ = &scp_dev_disk;
    Range::each(&opt.range,(function<void_(const_CylHead_&)> *)&local_40,false);
    std::_Function_base::~_Function_base((_Function_base *)&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&scp_dev_disk.super___shared_ptr<SCPDevDisk,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    if (local_58 != (long *)0x0) {
      (**(code **)(*local_58 + 8))();
    }
  }
  return !bVar1;
}

Assistant:

bool WriteSuperCardPro(const std::string& path, std::shared_ptr<Disk>& disk)
{
    if (util::lowercase(path) != "scp:")
        return false;

    auto supercardpro = SuperCardPro::Open();
    if (!supercardpro)
        throw util::exception("failed to open SuperCard Pro device");

    auto scp_dev_disk = std::make_shared<SCPDevDisk>(std::move(supercardpro));
    ValidateRange(opt.range, MAX_TRACKS, MAX_SIDES, 1, scp_dev_disk->cyls(), scp_dev_disk->heads());

    opt.range.each([&](const CylHead& cylhead)
        {
            auto trackdata = disk->read(cylhead);
            Message(msgStatus, "Writing %s", CH(cylhead.cyl, cylhead.head));
            scp_dev_disk->write(std::move(trackdata));
        });

    return true;
}